

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall ON_PolyCurve::IsPlanar(ON_PolyCurve *this,ON_Plane *plane,double tolerance)

{
  ON_Curve *this_00;
  double dVar1;
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  bool bVar2;
  int iVar3;
  uint uVar4;
  double *pdVar5;
  ON_Curve **ppOVar6;
  undefined4 uVar7;
  ON_3dVector local_210;
  ON_Interval local_1f8;
  ON_3dPoint local_1e8;
  int local_1cc;
  undefined1 auStack_1c8 [4];
  int i;
  ON_3dPoint local_1b8;
  ON_3dVector local_1a0;
  undefined1 auStack_188 [8];
  ON_3dVector X;
  undefined1 auStack_168 [8];
  ON_3dPoint Q;
  ON_3dPoint P;
  ON_3dPoint local_130;
  ON_3dPoint local_118;
  undefined1 local_100 [8];
  ON_Line line;
  ON_Curve *crv;
  undefined1 local_b0 [4];
  int count;
  ON_Plane test_plane;
  bool rc;
  double tolerance_local;
  ON_Plane *plane_local;
  ON_PolyCurve *this_local;
  
  iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
  if (iVar3 == 2) {
    bVar2 = ON_Curve::IsPlanar(&this->super_ON_Curve,plane,tolerance);
    return bVar2;
  }
  test_plane.plane_equation.d._7_1_ = 0;
  ON_Plane::ON_Plane((ON_Plane *)local_b0);
  iVar3 = Count(this);
  line.to.z = (double)FirstSegmentCurve(this);
  uVar7 = SUB84(tolerance,0);
  if ((iVar3 == 1) && ((ON_Curve *)line.to.z != (ON_Curve *)0x0)) {
    iVar3 = (*(((ON_Curve *)line.to.z)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x32])
                      (uVar7,line.to.z,plane);
    test_plane.plane_equation.d._7_1_ = (byte)iVar3 & 1;
  }
  else if (1 < iVar3) {
    uVar4 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2e])(uVar7)
    ;
    if ((uVar4 & 1) != 0) {
      if (plane != (ON_Plane *)0x0) {
        ON_Curve::PointAtStart(&local_118,&this->super_ON_Curve);
        ON_Curve::PointAtEnd(&local_130,&this->super_ON_Curve);
        from_pt.y = local_118.y;
        from_pt.x = local_118.x;
        from_pt.z = local_118.z;
        to_pt.y = local_130.y;
        to_pt.x = local_130.x;
        to_pt.z = local_130.z;
        ON_Line::ON_Line((ON_Line *)local_100,from_pt,to_pt);
        bVar2 = ON_Line::InPlane((ON_Line *)local_100,plane,tolerance);
        if (!bVar2) {
          ON_Line::InPlane((ON_Line *)local_100,plane,0.0);
        }
        ON_Line::~ON_Line((ON_Line *)local_100);
      }
      this_local._7_1_ = true;
      goto LAB_007fa040;
    }
    bVar2 = GetTestPlane(&this->super_ON_Curve,(ON_Plane *)local_b0);
    if (!bVar2) {
      pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,0);
      bVar2 = ON_Curve::Ev1Der(&this->super_ON_Curve,*pdVar5,(ON_3dPoint *)&Q.z,
                               (ON_3dVector *)auStack_188,0,(int *)0x0);
      if (!bVar2) {
        this_local._7_1_ = false;
        goto LAB_007fa040;
      }
      bVar2 = ON_3dVector::Unitize((ON_3dVector *)auStack_188);
      if (!bVar2) {
        (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
        dVar1 = ON_Interval::ParameterAt((ON_Interval *)auStack_1c8,0.5);
        ON_Curve::PointAt(&local_1b8,&this->super_ON_Curve,dVar1);
        ON_3dPoint::operator-(&local_1a0,&local_1b8,(ON_3dPoint *)&Q.z);
        X.y = local_1a0.z;
        auStack_188 = (undefined1  [8])local_1a0.x;
        X.x = local_1a0.y;
        bVar2 = ON_3dVector::Unitize((ON_3dVector *)auStack_188);
        if (!bVar2) {
          this_local._7_1_ = false;
          goto LAB_007fa040;
        }
      }
      for (local_1cc = 1; local_1cc < iVar3; local_1cc = local_1cc + 1) {
        ppOVar6 = ON_SimpleArray<ON_Curve_*>::operator[]
                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_1cc);
        if (*ppOVar6 != (ON_Curve *)0x0) {
          ppOVar6 = ON_SimpleArray<ON_Curve_*>::operator[]
                              (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_1cc);
          this_00 = *ppOVar6;
          ppOVar6 = ON_SimpleArray<ON_Curve_*>::operator[]
                              (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_1cc);
          (*((*ppOVar6)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
          dVar1 = ON_Interval::ParameterAt(&local_1f8,0.5);
          ON_Curve::PointAt(&local_1e8,this_00,dVar1);
          Q.y = local_1e8.z;
          auStack_168 = (undefined1  [8])local_1e8.x;
          Q.x = local_1e8.y;
          ON_3dPoint::operator-(&local_210,(ON_3dPoint *)auStack_168,(ON_3dPoint *)&Q.z);
          bVar2 = ON_Plane::CreateFromFrame
                            ((ON_Plane *)local_b0,(ON_3dPoint *)&Q.z,(ON_3dVector *)auStack_188,
                             &local_210);
          if (bVar2) break;
        }
      }
      if (iVar3 <= local_1cc) {
        this_local._7_1_ = false;
        goto LAB_007fa040;
      }
    }
    uVar4 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x33])
                      (uVar7,this,local_b0);
    test_plane.plane_equation.d._7_1_ = (byte)uVar4 & 1;
    if (((uVar4 & 1) != 0) && (plane != (ON_Plane *)0x0)) {
      memcpy(plane,local_b0,0x80);
    }
    if (((((test_plane.plane_equation.d._7_1_ & 1) != 0) && (plane != (ON_Plane *)0x0)) &&
        (uVar4 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34])()
        , (uVar4 & 1) != 0)) &&
       (iVar3 = ON_ClosedCurveOrientation(&this->super_ON_Curve,plane), iVar3 < 0)) {
      ON_Plane::Flip(plane);
    }
  }
  this_local._7_1_ = (bool)(test_plane.plane_equation.d._7_1_ & 1);
LAB_007fa040:
  ON_Plane::~ON_Plane((ON_Plane *)local_b0);
  return this_local._7_1_;
}

Assistant:

bool
ON_PolyCurve::IsPlanar(
      ON_Plane* plane, // if not nullptr and true is returned, then plane parameters
                         // are filled in
      double tolerance // tolerance to use when checking linearity
      ) const
{
  if ( Dimension() == 2 )
  {
    return ON_Curve::IsPlanar(plane,tolerance);
  }

  bool rc = false;
  ON_Plane test_plane;
  const int count = Count();
  const ON_Curve* crv = FirstSegmentCurve();
  if ( count == 1 && crv )
    rc = crv->IsPlanar( plane, tolerance );
  else if ( count > 1 )
  {
    if ( IsLinear(tolerance) )
    {
      if ( plane )
      {
        ON_Line line(PointAtStart(), PointAtEnd() );
        if ( !line.InPlane( *plane, tolerance ) )
          line.InPlane( *plane, 0.0 );
      }
      return true;
    }
    if ( !GetTestPlane( *this, test_plane ) )
    {
      // 5 May 2006 Dale Lear
      //   Added additional attempts to get a test_plane
      //   for poorly parameterized polycurves. (RR 20057 fix).
      ON_3dPoint P, Q;
      ON_3dVector X;
      if (!Ev1Der(m_t[0],P,X))
        return false;

      if ( !X.Unitize() )
      {
        X = PointAt(Domain().ParameterAt(0.5)) - P;
        if ( !X.Unitize() )
          return false;
      }

      int i;
      for ( i = 1; i < count; i++ )
      {
        if ( m_segment[i] )
        {
          Q = m_segment[i]->PointAt(m_segment[i]->Domain().ParameterAt(0.5));
          if ( test_plane.CreateFromFrame(P,X,Q-P) )
            break;
        }
      }
      if ( i >= count )
        return false;
    }
    rc = IsInPlane( test_plane, tolerance );
    if (rc && plane)
      *plane = test_plane;

    // RH-75060 GBA 9-June-23 
     // For a planar simple closed curve we should return the plane
     // whose orientation that matches the curve orientation.
    if (rc && plane && IsClosed())
    {
      if (ON_ClosedCurveOrientation(*this, *plane) < 0)
        plane->Flip();
    }
  }
  return rc;
}